

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::WriteAmpEnableDelay(AmpIO *this,uint index,uint8_t ampdelay)

{
  BasePort *pBVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  uint channel;
  uint32_t cfg;
  bool ret;
  uint8_t ampdelay_local;
  uint index_local;
  AmpIO *this_local;
  
  channel._2_1_ = false;
  uVar3 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar3 < 8) {
    this_local._7_1_ = false;
  }
  else {
    bVar2 = HasQLA(this);
    if (((bVar2) && ((this->super_FpgaIO).super_BoardIO.port != (BasePort *)0x0)) &&
       (index < this->NumMotors)) {
      pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
      iVar4 = (*pBVar1->_vptr_BasePort[0x24])
                        (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                         (ulong)((index + 1) * 0x10 | 0xb),
                         (ulong)((uint)ampdelay << 0x10 | 0x2000000));
      channel._2_1_ = (bool)((byte)iVar4 & 1);
    }
    this_local._7_1_ = channel._2_1_;
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::WriteAmpEnableDelay(unsigned int index, uint8_t ampdelay)
{
    bool ret = false;
    if (GetFirmwareVersion() < 8) return ret;

    if (HasQLA() && port && (index < NumMotors)) {
        uint32_t cfg = MCFG_SET_AMP_DELAY | (ampdelay<<16);
        unsigned int channel = (index+1) << 4;
        ret = port->WriteQuadlet(BoardId, channel | MOTOR_CONFIG_REG, cfg);
    }
    return ret;
}